

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# equality.cpp
# Opt level: O2

void __thiscall
Equality_unitsNotEqualByUnitPrefixOnly_Test::~Equality_unitsNotEqualByUnitPrefixOnly_Test
          (Equality_unitsNotEqualByUnitPrefixOnly_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(Equality, unitsNotEqualByUnitPrefixOnly)
{
    libcellml::UnitsPtr u1 = libcellml::Units::create("unitsA");
    libcellml::UnitsPtr u2 = libcellml::Units::create("unitsA");

    u1->addUnit("second", 3, 2.0, 5.0);
    u2->addUnit("second", 4, 2.0, 5.0);

    EXPECT_FALSE(u1->equals(u2));
    EXPECT_FALSE(u2->equals(u1));
    EXPECT_FALSE(libcellml::Units::equivalent(u1, u2));
}